

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItemPrivate::setVisibleHelper
          (QGraphicsItemPrivate *this,bool newVisible,bool explicitly,bool update,bool hiddenByPanel
          )

{
  QGraphicsItem **ppQVar1;
  long lVar2;
  QGraphicsItemPrivate *pQVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  WindowType WVar7;
  int iVar8;
  ulong uVar9;
  QGraphicsItemCache *this_00;
  QGraphicsWidget *pQVar10;
  QGraphicsItem *pQVar11;
  QGraphicsItem *pQVar12;
  undefined7 in_register_00000011;
  QGraphicsItemPrivate *pQVar13;
  long lVar14;
  QGraphicsItem **ppQVar15;
  long in_FS_OFFSET;
  QGraphicsItem *q;
  QVariant local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = this->q_ptr;
  uVar9 = *(ulong *)&this->field_0x160;
  if ((int)CONCAT71(in_register_00000011,explicitly) != 0) {
    uVar9 = uVar9 & 0xffffffffffffffbf | (ulong)!newVisible << 6;
    *(ulong *)&this->field_0x160 = uVar9;
  }
  q = pQVar12;
  if ((((uVar9 & 0x20) == 0) != newVisible) ||
     ((newVisible && this->parent != (QGraphicsItem *)0x0 &&
      ((((this->parent->d_ptr).d)->field_0x160 & 0x20) == 0)))) goto LAB_005719c1;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)&local_78,(uint)newVisible);
  (*pQVar12->_vptr_QGraphicsItem[0x21])(&local_58,pQVar12,2,&local_78);
  ::QVariant::~QVariant((QVariant *)&local_78);
  bVar4 = (bool)::QVariant::toBool();
  if (((*(ulong *)&this->field_0x160 & 0x20) == 0) == bVar4) {
    *(ulong *)&this->field_0x160 =
         *(ulong *)&this->field_0x160 & 0xffffffffffffffdf | (ulong)bVar4 << 5;
    if (update) {
      extra((QVariant *)&local_78,this,ExtraCacheData);
      this_00 = (QGraphicsItemCache *)qvariant_cast<void*>((QVariant *)&local_78);
      ::QVariant::~QVariant((QVariant *)&local_78);
      if (this_00 != (QGraphicsItemCache *)0x0) {
        QGraphicsItemCache::purge(this_00);
      }
      if (this->scene != (QGraphicsScene *)0x0) {
        invalidateParentGraphicsEffectsRecursively(this);
        local_78._16_8_ = 0;
        uStack_60 = 0;
        local_78.shared = (PrivateShared *)0x0;
        local_78._8_8_ = 0;
        QGraphicsScenePrivate::markDirty
                  (*(QGraphicsScenePrivate **)&this->scene->field_0x8,this->q_ptr,
                   (QRectF *)&local_78,false,true,false,false,false);
      }
    }
    bVar5 = QGraphicsItem::hasFocus(this->q_ptr);
    if (bVar4 == false) {
      if (this->scene != (QGraphicsScene *)0x0) {
        bVar6 = QListSpecialMethodsBase<QGraphicsItem*>::contains<QGraphicsItem*>
                          ((QListSpecialMethodsBase<QGraphicsItem*> *)
                           (*(long *)&this->scene->field_0x8 + 0x1e0),&q);
        if (bVar6) {
          QGraphicsItem::ungrabMouse(q);
        }
        bVar6 = QListSpecialMethodsBase<QGraphicsItem*>::contains<QGraphicsItem*>
                          ((QListSpecialMethodsBase<QGraphicsItem*> *)
                           (*(long *)&this->scene->field_0x8 + 0x1f8),&q);
        if (bVar6) {
          QGraphicsItem::ungrabKeyboard(q);
        }
        if (((*(ulong *)&((q->d_ptr).d)->field_0x160 & 0x400000000000) != 0) &&
           (this->panelModality != NonModal)) {
          QGraphicsScenePrivate::leaveModal
                    (*(QGraphicsScenePrivate **)&this->scene->field_0x8,this->q_ptr);
        }
      }
      if ((bVar5) && ((QGraphicsScene *)this->scene != (QGraphicsScene *)0x0)) {
        pQVar12 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
        if (((this->field_0x163 & 1) != 0) &&
           ((*(ulong *)&((pQVar12->d_ptr).d)->field_0x160 & 0x400000000000) == 0)) {
          pQVar11 = this->q_ptr;
          while (pQVar12 != pQVar11) {
            pQVar10 = QGraphicsItem::parentWidget(pQVar12);
            if ((pQVar10 == (QGraphicsWidget *)0x0) ||
               (pQVar12 = &(pQVar10->super_QGraphicsObject).super_QGraphicsItem,
               (*(ulong *)&((pQVar10->super_QGraphicsObject).super_QGraphicsItem.d_ptr.d)->
                           field_0x160 & 0x400000000000) != 0)) goto LAB_005716ed;
          }
          iVar8 = (*pQVar11[-1]._vptr_QGraphicsItem[0x1e])(pQVar11 + -1);
          if ((char)iVar8 != '\0') goto LAB_005716fb;
        }
LAB_005716ed:
        clearFocusHelper(this,false,hiddenByPanel);
      }
LAB_005716fb:
      bVar6 = QGraphicsItem::isSelected(this->q_ptr);
      if (bVar6) {
        QGraphicsItem::setSelected(this->q_ptr,false);
      }
    }
    else {
      uVar9 = *(ulong *)&this->field_0x160;
      *(ulong *)&this->field_0x160 = uVar9 | 0x50000000000000;
      if (this->scene != (QGraphicsScene *)0x0) {
        if (((uint)uVar9 >> 0x18 & 1) != 0) {
          pQVar10 = (QGraphicsWidget *)(this->q_ptr + -1);
          if (this->q_ptr == (QGraphicsItem *)0x0) {
            pQVar10 = (QGraphicsWidget *)0x0;
          }
          WVar7 = QGraphicsWidget::windowType((QGraphicsWidget *)pQVar10);
          if (WVar7 == Popup) {
            QGraphicsScenePrivate::addPopup
                      (*(QGraphicsScenePrivate **)&this->scene->field_0x8,pQVar10);
          }
        }
        if (((*(ulong *)&((q->d_ptr).d)->field_0x160 & 0x400000000000) != 0) &&
           (this->panelModality != NonModal)) {
          QGraphicsScenePrivate::enterModal
                    (*(QGraphicsScenePrivate **)&this->scene->field_0x8,this->q_ptr,NonModal);
        }
      }
    }
    if (update) {
      if ((*(ulong *)&this->field_0x160 & 0x8001000000000) == 0) {
        bVar6 = true;
      }
      else {
        bVar6 = (bool)((byte)(uint)(*(ulong *)&this->field_0x160 >> 0x2a) & 1);
      }
    }
    else {
      bVar6 = false;
    }
    ppQVar15 = &this->parent;
    ppQVar1 = (this->children).d.ptr;
    lVar2 = (this->children).d.size;
    for (lVar14 = 0; lVar2 << 3 != lVar14; lVar14 = lVar14 + 8) {
      pQVar13 = *(QGraphicsItemPrivate **)(*(long *)((long)ppQVar1 + lVar14) + 8);
      if ((bVar4 == false) || ((pQVar13->field_0x160 & 0x40) == 0)) {
        setVisibleHelper(pQVar13,bVar4,false,bVar6,hiddenByPanel);
      }
    }
    if (this->scene != (QGraphicsScene *)0x0) {
      if ((*(ulong *)&((q->d_ptr).d)->field_0x160 & 0x400000000000) != 0) {
        if (bVar4 == false) {
          bVar6 = QGraphicsItem::isActive(q);
          if (bVar6) {
            QGraphicsScene::setActivePanel((QGraphicsScene *)this->scene,this->parent);
          }
        }
        else if ((*ppQVar15 != (QGraphicsItem *)0x0) &&
                (bVar6 = QGraphicsItem::isActive(*ppQVar15), bVar6)) {
          QGraphicsItem::setActive(q,true);
        }
      }
      if (this->scene != (QGraphicsScene *)0x0) {
        if (bVar4 == false) {
          if (bVar5) {
            while (*ppQVar15 != (QGraphicsItem *)0x0) {
              pQVar13 = ((*ppQVar15)->d_ptr).d;
              if ((*(ulong *)&pQVar13->field_0x160 & 0x800000000000) != 0) {
                if ((*(ulong *)&pQVar13->field_0x160 & 0x20) != 0) {
                  bVar4 = true;
                  goto LAB_00571971;
                }
                break;
              }
              ppQVar15 = &pQVar13->parent;
            }
          }
        }
        else {
          while (*ppQVar15 != (QGraphicsItem *)0x0) {
            pQVar13 = ((*ppQVar15)->d_ptr).d;
            if ((*(ulong *)&pQVar13->field_0x160 & 0x800000000000) != 0) {
              pQVar12 = pQVar13->focusScopeItem;
              if ((this->q_ptr == pQVar12) ||
                 (bVar4 = QGraphicsItem::isAncestorOf(this->q_ptr,pQVar12), bVar4)) {
                pQVar3 = (pQVar12->d_ptr).d;
                goto LAB_005718bc;
              }
              break;
            }
            ppQVar15 = &pQVar13->parent;
          }
          pQVar12 = this->subFocusItem;
          if ((pQVar12 == (QGraphicsItem *)0x0) ||
             (pQVar11 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene), pQVar12 == pQVar11
             )) {
            if ((((*(ulong *)&this->field_0x160 & 0x800000000000) != 0) &&
                (pQVar12 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene),
                pQVar12 == (QGraphicsItem *)0x0)) &&
               (bVar4 = QGraphicsItem::isAncestorOf
                                  (q,*(QGraphicsItem **)(*(long *)&this->scene->field_0x8 + 400)),
               bVar4)) {
              QGraphicsItem::setFocus(this->q_ptr,OtherFocusReason);
            }
          }
          else {
            QGraphicsScene::setFocusItem((QGraphicsScene *)this->scene,pQVar12,OtherFocusReason);
          }
        }
      }
    }
    goto LAB_00571976;
  }
  goto LAB_005719b7;
  while (pQVar3 = (pQVar13->focusScopeItem->d_ptr).d, (pQVar3->field_0x160 & 0x20) != 0) {
LAB_005718bc:
    pQVar13 = pQVar3;
    if (pQVar13->focusScopeItem == (QGraphicsItem *)0x0) break;
  }
  bVar4 = false;
LAB_00571971:
  setFocusHelper(pQVar13,OtherFocusReason,true,bVar4);
LAB_00571976:
  (*this->q_ptr->_vptr_QGraphicsItem[0x21])(&local_98,this->q_ptr,0xc,&local_58);
  ::QVariant::~QVariant(&local_98);
  if ((this->field_0x167 & 1) != 0) {
    QGraphicsObject::visibleChanged((QGraphicsObject *)(this->q_ptr + -1));
  }
LAB_005719b7:
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_005719c1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setVisibleHelper(bool newVisible, bool explicitly,
                                            bool update, bool hiddenByPanel)
{
    Q_Q(QGraphicsItem);

    // Update explicit bit.
    if (explicitly)
        explicitlyHidden = newVisible ? 0 : 1;

    // Check if there's nothing to do.
    if (visible == quint32(newVisible))
        return;

    // Don't show child if parent is not visible
    if (parent && newVisible && !parent->d_ptr->visible)
        return;

    // Modify the property.
    const QVariant newVisibleVariant(q_ptr->itemChange(QGraphicsItem::ItemVisibleChange,
                                                       quint32(newVisible)));
    newVisible = newVisibleVariant.toBool();
    if (visible == quint32(newVisible))
        return;
    visible = newVisible;

    // Schedule redrawing
    if (update) {
        QGraphicsItemCache *c = (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
        if (c)
            c->purge();
        if (scene) {
#if QT_CONFIG(graphicseffect)
            invalidateParentGraphicsEffectsRecursively();
#endif // QT_CONFIG(graphicseffect)
            scene->d_func()->markDirty(q_ptr, QRectF(), /*invalidateChildren=*/false, /*force=*/true);
        }
    }

    // Certain properties are dropped as an item becomes invisible.
    bool hasFocus = q_ptr->hasFocus();
    if (!newVisible) {
        if (scene) {
            if (scene->d_func()->mouseGrabberItems.contains(q))
                q->ungrabMouse();
            if (scene->d_func()->keyboardGrabberItems.contains(q))
                q->ungrabKeyboard();
            if (q->isPanel() && panelModality != QGraphicsItem::NonModal)
                scene->d_func()->leaveModal(q_ptr);
        }
        if (hasFocus && scene) {
            // Hiding the focus item or the closest non-panel ancestor of the focus item
            QGraphicsItem *focusItem = scene->focusItem();
            bool clear = true;
            if (isWidget && !focusItem->isPanel()) {
                do {
                    if (focusItem == q_ptr) {
                        clear = !static_cast<QGraphicsWidget *>(q_ptr)->focusNextPrevChild(true);
                        break;
                    }
                } while ((focusItem = focusItem->parentWidget()) && !focusItem->isPanel());
            }
            if (clear)
                clearFocusHelper(/* giveFocusToParent = */ false, hiddenByPanel);
        }
        if (q_ptr->isSelected())
            q_ptr->setSelected(false);
    } else {
        geometryChanged = 1;
        paintedViewBoundingRectsNeedRepaint = 1;
        if (scene) {
            if (isWidget) {
                QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(q_ptr);
                if (widget->windowType() == Qt::Popup)
                    scene->d_func()->addPopup(widget);
            }
            if (q->isPanel() && panelModality != QGraphicsItem::NonModal) {
                scene->d_func()->enterModal(q_ptr);
            }
        }
    }

    // Update children with explicitly = false.
    const bool updateChildren = update && !((flags & QGraphicsItem::ItemClipsChildrenToShape
                                             || flags & QGraphicsItem::ItemContainsChildrenInShape)
                                            && !(flags & QGraphicsItem::ItemHasNoContents));
    for (QGraphicsItem *child : std::as_const(children)) {
        if (!newVisible || !child->d_ptr->explicitlyHidden)
            child->d_ptr->setVisibleHelper(newVisible, false, updateChildren, hiddenByPanel);
    }

    // Update activation
    if (scene && q->isPanel()) {
        if (newVisible) {
            if (parent && parent->isActive())
                q->setActive(true);
        } else {
            if (q->isActive())
                scene->setActivePanel(parent);
        }
    }

    // Enable subfocus
    if (scene) {
        if (newVisible) {
            // Item is shown
            QGraphicsItem *p = parent;
            bool done = false;
            while (p) {
                if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
                    QGraphicsItem *fsi = p->d_ptr->focusScopeItem;
                    if (q_ptr == fsi || q_ptr->isAncestorOf(fsi)) {
                        done = true;
                        while (fsi->d_ptr->focusScopeItem && fsi->d_ptr->focusScopeItem->isVisible())
                            fsi = fsi->d_ptr->focusScopeItem;
                        fsi->d_ptr->setFocusHelper(Qt::OtherFocusReason, /* climb = */ true,
                                                   /* focusFromHide = */ false);
                    }
                    break;
                }
                p = p->d_ptr->parent;
            }
            if (!done) {
                QGraphicsItem *fi = subFocusItem;
                if (fi && fi != scene->focusItem()) {
                    scene->setFocusItem(fi);
                } else if (flags & QGraphicsItem::ItemIsFocusScope &&
                           !scene->focusItem() &&
                           q->isAncestorOf(scene->d_func()->lastFocusItem)) {
                    q_ptr->setFocus();
                }
            }
        } else {
            // Item is hidden
            if (hasFocus) {
                QGraphicsItem *p = parent;
                while (p) {
                    if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
                        if (p->d_ptr->visible) {
                            p->d_ptr->setFocusHelper(Qt::OtherFocusReason, /* climb = */ true,
                                                     /* focusFromHide = */ true);
                        }
                        break;
                    }
                    p = p->d_ptr->parent;
                }
            }
        }
    }

    // Deliver post-change notification.
    q_ptr->itemChange(QGraphicsItem::ItemVisibleHasChanged, newVisibleVariant);

    if (isObject)
        emit static_cast<QGraphicsObject *>(q_ptr)->visibleChanged();
}